

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

Matrix_t Inv4(Matrix_t sMatrix)

{
  long lVar1;
  float fVar2;
  undefined1 auVar3 [16];
  Matrix_t MVar4;
  
  MVar4 = Companion_Mat4(sMatrix);
  fVar2 = Det4(sMatrix);
  if ((sMatrix._8_4_ & 0xffff) == 0x404) {
    lVar1 = 0;
    do {
      auVar3._4_4_ = fVar2;
      auVar3._0_4_ = fVar2;
      auVar3._8_4_ = fVar2;
      auVar3._12_4_ = fVar2;
      auVar3 = divps(*(undefined1 (*) [16])((long)MVar4.pMatrix + lVar1),auVar3);
      *(undefined1 (*) [16])((long)MVar4.pMatrix + lVar1) = auVar3;
      lVar1 = lVar1 + 0x10;
    } while (lVar1 != 0x40);
  }
  else {
    puts("ERROR: Cannot calculate inverse matrix, matrix must be a 4x4 square matrix!");
    MVar4 = (Matrix_t)ZEXT816(0);
  }
  return MVar4;
}

Assistant:

Matrix_t Inv4(Matrix_t sMatrix)
{
	Matrix_t cp_mat;
	Matrix_t mat_err = {NULL, 0, 0};
	float det;
	int x, y;
	cp_mat = Companion_Mat4(sMatrix);			 //求伴随矩阵
	det = Det4(sMatrix);						 //求矩阵行列式
	if (sMatrix.row == 4 && sMatrix.column == 4) //(A^-1) = 1/|A|*(A*)
	{
		for (x = 0; x < 4; x++)
		{
			for (y = 0; y < 4; y++)
			{
				*(cp_mat.pMatrix + x * 4 + y) /= det;
			}
		}
		return cp_mat;
	}
	else
	{
		printf("ERROR: Cannot calculate inverse matrix, matrix must be a 4x4 square matrix!\n");
		return mat_err;
	}
}